

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

Vec_Int_t *
Iso_ManFindMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vPerm1_,Vec_Int_t *vPerm2_,
                  int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vMap2to1;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  Vec_Int_t *vInvPerm2;
  Vec_Int_t *local_40;
  size_t local_38;
  
  if ((((pAig1->nObjs[2] == pAig2->nObjs[2]) && (pAig1->nObjs[3] == pAig2->nObjs[3])) &&
      (pAig1->nRegs == pAig2->nRegs)) &&
     (pAig1->nObjs[6] + pAig1->nObjs[5] == pAig2->nObjs[6] + pAig2->nObjs[5])) {
    iVar2 = Aig_ManLevelNum(pAig1);
    iVar3 = Aig_ManLevelNum(pAig2);
    if (iVar2 == iVar3) {
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      p = vPerm1_;
      if (vPerm1_ == (Vec_Int_t *)0x0) {
        p = Saig_ManFindIsoPerm(pAig1,fVerbose);
      }
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      p_00 = vPerm2_;
      if (vPerm2_ == (Vec_Int_t *)0x0) {
        p_00 = Saig_ManFindIsoPerm(pAig2,fVerbose);
      }
      if ((vPerm1_ != (Vec_Int_t *)0x0) && (vPerm1_->nSize != pAig1->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x121,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if ((vPerm2_ != (Vec_Int_t *)0x0) && (vPerm2_->nSize != pAig2->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x123,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      vMap2to1 = (Vec_Int_t *)malloc(0x10);
      vMap2to1->nCap = 0;
      vMap2to1->nSize = 0;
      vMap2to1->pArray = (int *)0x0;
      uVar1 = p_00->nSize;
      if ((ulong)uVar1 != 0) {
        iVar2 = *p_00->pArray;
        if (1 < (int)uVar1) {
          uVar6 = 1;
          do {
            iVar3 = p_00->pArray[uVar6];
            if (iVar2 <= iVar3) {
              iVar2 = iVar3;
            }
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        uVar1 = iVar2 + 1;
        if (-1 < iVar2) {
          local_38 = (ulong)uVar1 << 2;
          piVar4 = (int *)malloc(local_38);
          vMap2to1->pArray = piVar4;
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vMap2to1->nCap = uVar1;
          memset(piVar4,0xff,local_38);
        }
        vMap2to1->nSize = uVar1;
        if (0 < p_00->nSize) {
          piVar4 = p_00->pArray;
          lVar5 = 0;
          do {
            uVar1 = piVar4[lVar5];
            if ((ulong)uVar1 != 0xffffffff) {
              if (((int)uVar1 < 0) || (iVar2 < (int)uVar1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              vMap2to1->pArray[uVar1] = (int)lVar5;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < p_00->nSize);
        }
      }
      local_40 = vMap2to1;
      if (0 < vMap2to1->nSize) {
        piVar4 = vMap2to1->pArray;
        lVar5 = 0;
        do {
          iVar2 = piVar4[lVar5];
          if (((long)iVar2 < 0) || (pAig1->nObjs[2] <= iVar2)) {
            __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(pAig1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                          ,0x129,
                          "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          if (p->nSize <= iVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar4[lVar5] = p->pArray[iVar2];
          lVar5 = lVar5 + 1;
        } while (lVar5 < vMap2to1->nSize);
      }
      if (vPerm1_ == (Vec_Int_t *)0x0) {
        Vec_IntFree(p);
      }
      if (vPerm2_ == (Vec_Int_t *)0x0) {
        Vec_IntFree(p_00);
      }
      iVar2 = Iso_ManCheckMapping(pAig1,pAig2,vMap2to1,fVerbose);
      if (iVar2 != 0) {
        return local_40;
      }
      Vec_IntFreeP(&local_40);
      return local_40;
    }
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Iso_ManFindMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vPerm1_, Vec_Int_t * vPerm2_, int fVerbose )
{
    Vec_Int_t * vPerm1, * vPerm2, * vInvPerm2;
    int i, Entry;
    if ( Aig_ManCiNum(pAig1) != Aig_ManCiNum(pAig2) )
        return NULL;
    if ( Aig_ManCoNum(pAig1) != Aig_ManCoNum(pAig2) )
        return NULL;
    if ( Aig_ManRegNum(pAig1) != Aig_ManRegNum(pAig2) )
        return NULL;
    if ( Aig_ManNodeNum(pAig1) != Aig_ManNodeNum(pAig2) )
        return NULL;
    if ( Aig_ManLevelNum(pAig1) != Aig_ManLevelNum(pAig2) )
        return NULL;
//    if ( Iso_ManNegEdgeNum(pAig1) != Iso_ManNegEdgeNum(pAig2) )
//        return NULL;
//    s_Counter++;

    if ( fVerbose ) 
        printf( "AIG1:\n" );
    vPerm1 = vPerm1_ ? vPerm1_ : Saig_ManFindIsoPerm( pAig1, fVerbose );
    if ( fVerbose )
        printf( "AIG1:\n" );
    vPerm2 = vPerm2_ ? vPerm2_ : Saig_ManFindIsoPerm( pAig2, fVerbose );
    if ( vPerm1_ )
        assert( Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1) );
    if ( vPerm2_ )
        assert( Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2) );
    // find canonical permutation
    // vPerm1/vPerm2 give canonical order of CIs of AIG1/AIG2
    vInvPerm2 = Vec_IntInvert( vPerm2, -1 );
    Vec_IntForEachEntry( vInvPerm2, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(pAig1) );
        Vec_IntWriteEntry( vInvPerm2, i, Vec_IntEntry(vPerm1, Entry) );
    }
    if ( vPerm1_ == NULL )
        Vec_IntFree( vPerm1 );
    if ( vPerm2_ == NULL )
        Vec_IntFree( vPerm2 );
    // check if they are indeed equivalent
    if ( !Iso_ManCheckMapping( pAig1, pAig2, vInvPerm2, fVerbose ) )
        Vec_IntFreeP( &vInvPerm2 );
    return vInvPerm2;
}